

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O0

double __thiscall HEVCStreamReader::getStreamFPS(HEVCStreamReader *this,void *curNalUnit)

{
  double local_20;
  double fps;
  void *curNalUnit_local;
  HEVCStreamReader *this_local;
  
  local_20 = 0.0;
  if (this->m_vps != (HevcVpsUnit *)0x0) {
    local_20 = HevcVpsUnit::getFPS(this->m_vps);
  }
  if (((local_20 == 0.0) && (!NAN(local_20))) && (this->m_sps != (HevcSpsUnit *)0x0)) {
    local_20 = HevcSpsUnit::getFPS(this->m_sps);
  }
  return local_20;
}

Assistant:

double HEVCStreamReader::getStreamFPS(void* curNalUnit)
{
    double fps = 0;
    if (m_vps)
        fps = m_vps->getFPS();
    if (fps == 0.0 && m_sps)
        fps = m_sps->getFPS();
    return fps;
}